

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O1

AbstractLoggingDevice * __thiscall
SLogLib::LoggingManager::QueryDevice(LoggingManager *this,string *deviceName)

{
  byte bVar1;
  LoggingManagerPriv *pLVar2;
  size_t __n;
  uint uVar3;
  int iVar4;
  AbstractLoggingDevice *pAVar5;
  vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>> *this_00;
  AbstractLoggingDevice *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  LoggingManagerPriv *pLVar6;
  string *__args;
  mutex *__mutex;
  long *plVar7;
  bool bVar8;
  uint uStack_6c;
  string local_50;
  
  __mutex = &this->mPriv->mLoggingDevicesMutex;
  __args = deviceName;
  uVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar3 != 0) {
    plVar7 = (long *)(ulong)uVar3;
    std::__throw_system_error(uVar3);
    bVar1 = *(byte *)(*plVar7 + 0x40);
    pAVar5 = (AbstractLoggingDevice *)CONCAT71((int7)((ulong)*plVar7 >> 8),bVar1);
    if ((bVar1 & 1) == 0) {
      gCallStack::__tls_init();
      this_00 = (vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>> *)
                __tls_get_addr(&PTR_0010afa0);
      std::vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&>
                (this_00,__args,__args_1,&uStack_6c);
      pAVar5 = extraout_RAX;
    }
    return pAVar5;
  }
  pLVar2 = this->mPriv;
  pLVar6 = pLVar2;
  do {
    pLVar6 = (LoggingManagerPriv *)
             (pLVar6->mLoggingDevices).
             super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pLVar6 == pLVar2) {
      pAVar5 = (AbstractLoggingDevice *)0x0;
      break;
    }
    pAVar5 = (AbstractLoggingDevice *)
             (pLVar6->mLoggingDevices).
             super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
             ._M_impl._M_node._M_size;
    if (pAVar5 == (AbstractLoggingDevice *)0x0) {
LAB_00105ebc:
      bVar8 = false;
    }
    else {
      AbstractLoggingDevice::Name_abi_cxx11_(&local_50,pAVar5);
      __n = deviceName->_M_string_length;
      if (__n != local_50._M_string_length) goto LAB_00105ebc;
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((deviceName->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
        bVar8 = iVar4 == 0;
      }
    }
    if ((pAVar5 != (AbstractLoggingDevice *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  } while (!bVar8);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pAVar5;
}

Assistant:

AbstractLoggingDevice* LoggingManager::QueryDevice(const std::string& deviceName)
{
	// Lock must be here because another thread can add/remove 
	// a new device while the for loop is running.
	std::lock_guard<std::mutex> _lock(mPriv->mLoggingDevicesMutex);
	
	for(AbstractLoggingDevice* _device : mPriv->mLoggingDevices)
	{
		if(_device && deviceName == _device->Name())
		{
			return _device;
		}
	}
	return nullptr;
}